

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

char * toInternetFormat(char *name)

{
  size_t sVar1;
  char *ptr;
  char *__dest;
  int local_30;
  int local_2c;
  int i;
  int lock;
  char *dns;
  char *domain;
  char *result;
  char *name_local;
  
  sVar1 = strlen(name);
  ptr = (char *)malloc(sVar1 + 2);
  sVar1 = strlen(name);
  __dest = (char *)malloc(sVar1 + 1);
  checkMalloc(ptr);
  checkMalloc(__dest);
  strcpy(__dest,name);
  local_2c = 0;
  sVar1 = strlen(__dest);
  if (__dest[sVar1 - 1] != '.') {
    strcat(__dest,".");
  }
  local_30 = 0;
  _i = ptr;
  while( true ) {
    sVar1 = strlen(__dest);
    if (sVar1 <= (ulong)(long)local_30) break;
    if (__dest[local_30] == '.') {
      *_i = (char)local_30 - (char)local_2c;
      for (; _i = _i + 1, local_2c < local_30; local_2c = local_2c + 1) {
        *_i = __dest[local_2c];
      }
      local_2c = local_2c + 1;
    }
    local_30 = local_30 + 1;
  }
  *_i = '\0';
  free(__dest);
  return ptr;
}

Assistant:

char *toInternetFormat(char *name)
{
    char *result = (char *) malloc(strlen(name) + 2);
    char *domain = (char *) malloc(strlen(name) + 1);
    checkMalloc(result);
    checkMalloc(domain);

    strcpy(domain, name);
    char *dns = result;
    int lock = 0;

    // 尾部补 “.”
    if (domain[strlen((char *) domain) - 1] != '.')
        strcat((char *) domain, ".");

    for (int i = 0; i < strlen((char *) domain); i++)
    {
        if (domain[i] == '.')
        {
            *dns++ = i - lock;
            for (; lock < i; lock++)
            {
                *dns++ = domain[lock];
            }
            lock++;
        }
    }
    *dns++ = '\0';

    free(domain);

    return result;
}